

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O2

char * google::protobuf::internal::TcParser::FastBmS1
                 (MessageLite *msg,char *ptr,ParseContext *ctx,TcFieldData data,
                 TcParseTableBase *table,uint64_t hasbits)

{
  uint uVar1;
  MicroString *str;
  ushort *puVar2;
  ulong uVar3;
  uint *puVar4;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 arena;
  ParseContext *ctx_00;
  ulong hasbits_00;
  char *pcVar5;
  
  if (data.field_0._0_1_ != '\0') {
    pcVar5 = MiniParse(msg,ptr,ctx,data,table,hasbits);
    return pcVar5;
  }
  str = RefAt<google::protobuf::internal::MicroString>(msg,(ulong)data.field_0 >> 0x30);
  arena = (anon_union_8_1_898a9ca8_for_TcFieldData_0)(msg->_internal_metadata_).ptr_;
  if ((arena.data & 1) != 0) {
    arena = (anon_union_8_1_898a9ca8_for_TcFieldData_0)
            ((anon_union_8_1_898a9ca8_for_TcFieldData_0 *)(arena.data & 0xfffffffffffffffe))->data;
  }
  pcVar5 = ptr + 1;
  if (arena.data == 0) {
    arena.data = 0;
  }
  puVar2 = (ushort *)
           EpsCopyInputStream::ReadMicroString
                     (&ctx->super_EpsCopyInputStream,pcVar5,str,(Arena *)arena);
  hasbits_00 = hasbits | 1L << ((ulong)data.field_0 >> 0x10 & 0x3f);
  if (puVar2 == (ushort *)0x0) {
    pcVar5 = Error(msg,pcVar5,ctx_00,(TcFieldData)arena,table,hasbits_00);
    return pcVar5;
  }
  if ((ctx->super_EpsCopyInputStream).limit_end_ <= puVar2) {
    if ((ulong)table->has_bits_offset != 0) {
      puVar4 = RefAt<unsigned_int>(msg,(ulong)table->has_bits_offset);
      *puVar4 = *puVar4 | (uint)hasbits_00;
    }
    return (char *)puVar2;
  }
  uVar1 = (uint)table->fast_idx_mask & (uint)*puVar2;
  if ((uVar1 & 7) == 0) {
    uVar3 = (ulong)(uVar1 & 0xfffffff8);
    pcVar5 = (char *)(**(code **)(&table[1].has_bits_offset + uVar3))
                               (msg,puVar2,ctx,
                                (ulong)*puVar2 ^ *(ulong *)(&table[1].fast_idx_mask + uVar3 * 2),
                                table,hasbits_00);
    return pcVar5;
  }
  protobuf_assumption_failed
            ("(idx & 7) == 0",
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_impl.h"
             ,0x452);
}

Assistant:

PROTOBUF_NOINLINE const char* TcParser::FastBmS1(PROTOBUF_TC_PARAM_DECL) {
  PROTOBUF_MUSTTAIL return SingularString<uint8_t, MicroString, kNoUtf8>(
      PROTOBUF_TC_PARAM_PASS);
}